

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherBase::Cleanup(GatherBase *this)

{
  int width;
  int height;
  GatherBase *this_local;
  
  width = TGBase::GetWindowWidth(&this->super_TGBase);
  height = TGBase::GetWindowHeight(&this->super_TGBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,0,width,
             height);
  glu::CallLogWrapper::glDisableVertexAttribArray
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vbo);
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->rbo);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->fbo);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->program);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, GetWindowWidth(), GetWindowHeight());
		glDisableVertexAttribArray(0);
		glDeleteTextures(1, &tex);
		glDeleteVertexArrays(1, &vao);
		glDeleteBuffers(1, &vbo);
		glDeleteRenderbuffers(1, &rbo);
		glDeleteFramebuffers(1, &fbo);
		glDeleteProgram(program);
		return NO_ERROR;
	}